

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O3

parasail_profile_t *
parasail_profile_create_stats_avx_256_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  long *plVar1;
  ulong *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  parasail_profile_t *ppVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  size_t size;
  uint uVar21;
  __m256i_64_t s;
  __m256i_64_t m;
  __m256i_64_t p;
  ulong local_c0 [4];
  ulong local_a0 [4];
  long local_80 [10];
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_stats_avx_256_64_cold_2();
  }
  else if (s1 == (char *)0x0) {
    parasail_profile_create_stats_avx_256_64_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar3 = matrix->size;
    iVar5 = _s1Len + 6;
    if (-1 < _s1Len + 3) {
      iVar5 = _s1Len + 3;
    }
    uVar21 = iVar5 >> 2;
    size = (long)(int)(uVar21 * uVar3) << 5;
    pvVar6 = parasail_memalign(0x20,size);
    if ((((pvVar6 != (void *)0x0) && (pvVar7 = parasail_memalign(0x20,size), pvVar7 != (void *)0x0))
        && (pvVar8 = parasail_memalign(0x20,size), pvVar8 != (void *)0x0)) &&
       (ppVar9 = parasail_profile_new(s1,_s1Len,matrix), ppVar9 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar3) {
        uVar10 = 1;
        if (1 < (int)uVar21) {
          uVar10 = (ulong)uVar21;
        }
        uVar13 = 0;
        lVar16 = 0;
        do {
          if (0 < _s1Len) {
            lVar16 = (long)(int)lVar16;
            iVar5 = 0;
            uVar12 = 0;
            do {
              iVar4 = matrix->type;
              lVar11 = 0;
              uVar19 = uVar12;
              iVar20 = iVar5;
              do {
                iVar18 = (int)uVar19;
                if (iVar4 == 0) {
                  if (iVar18 < _s1Len) {
                    iVar15 = matrix->mapper[(byte)s1[uVar19]] + (int)uVar13 * uVar3;
                    goto LAB_007a6b28;
                  }
LAB_007a6b35:
                  lVar17 = 0;
                }
                else {
                  if (_s1Len <= iVar18) goto LAB_007a6b35;
                  iVar15 = matrix->mapper[(byte)matrix->alphabet[uVar13]] + iVar20;
LAB_007a6b28:
                  lVar17 = (long)matrix->matrix[iVar15];
                }
                local_80[lVar11] = lVar17;
                if (iVar18 < _s1Len) {
                  uVar14 = (ulong)(uVar13 == (uint)matrix->mapper[(byte)s1[uVar19]]);
                }
                else {
                  uVar14 = 0;
                }
                local_a0[lVar11] = uVar14;
                local_c0[lVar11] = (ulong)(0 < lVar17);
                uVar19 = uVar19 + uVar21;
                lVar11 = lVar11 + 1;
                iVar20 = iVar20 + uVar21 * uVar3;
              } while (lVar11 != 4);
              lVar11 = lVar16 * 0x20;
              plVar1 = (long *)((long)pvVar6 + lVar11);
              *plVar1 = local_80[0];
              plVar1[1] = local_80[1];
              plVar1[2] = local_80[2];
              plVar1[3] = local_80[3];
              puVar2 = (ulong *)((long)pvVar7 + lVar11);
              *puVar2 = local_a0[0];
              puVar2[1] = local_a0[1];
              puVar2[2] = local_a0[2];
              puVar2[3] = local_a0[3];
              puVar2 = (ulong *)((long)pvVar8 + lVar11);
              *puVar2 = local_c0[0];
              puVar2[1] = local_c0[1];
              puVar2[2] = local_c0[2];
              puVar2[3] = local_c0[3];
              lVar16 = lVar16 + 1;
              uVar12 = uVar12 + 1;
              iVar5 = iVar5 + uVar3;
            } while (uVar12 != uVar10);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar3);
      }
      (ppVar9->profile64).score = pvVar6;
      (ppVar9->profile64).matches = pvVar7;
      (ppVar9->profile64).similar = pvVar8;
      ppVar9->free = parasail_free___m256i;
      return ppVar9;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_avx_256_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 4; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_64_t p;
            __m256i_64_t m;
            __m256i_64_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], p.m);
            _mm256_store_si256(&vProfileM[index], m.m);
            _mm256_store_si256(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->profile64.matches = vProfileM;
    profile->profile64.similar = vProfileS;
    profile->free = &parasail_free___m256i;
    return profile;
}